

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

upb_Message * upb_Message_New(upb_MiniTable *m,upb_Arena *a)

{
  upb_Message *puVar1;
  upb_Arena *a_local;
  upb_MiniTable *m_local;
  
  puVar1 = _upb_Message_New(m,a);
  return puVar1;
}

Assistant:

upb_Message* upb_Message_New(const upb_MiniTable* m, upb_Arena* a) {
  return _upb_Message_New(m, a);
}